

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

int Bac_ManAddBarbuf(Gia_Man_t *pNew,int iRes,Bac_Man_t *p,int iLNtk,int iLObj,int iRNtk,int iRObj,
                    Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint uVar6;
  int Entry;
  
  if ((uint)iRes < 2) {
    return iRes;
  }
  if (iRes < 1) {
    __assert_fail("iRes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x5c,
                  "int Bac_ManAddBarbuf(Gia_Man_t *, int, Bac_Man_t *, int, int, int, int, Vec_Int_t *)"
                 );
  }
  if (((vMap != (Vec_Int_t *)0x0) && ((int)((uint)iRes >> 1) < vMap->nSize)) &&
     (uVar1 = vMap->pArray[(uint)iRes >> 1], -1 < (int)uVar1)) {
    uVar6 = uVar1 >> 1;
    if ((int)uVar6 < (p->vBuf2LeafNtk).nSize) {
      if ((p->vBuf2LeafNtk).pArray[uVar6] != iLNtk) goto LAB_0089ecd1;
      if ((int)uVar6 < (p->vBuf2RootNtk).nSize) {
        if ((p->vBuf2RootNtk).pArray[uVar6] != iRNtk) goto LAB_0089ecd1;
        if ((int)uVar6 < pNew->vBarBufs->nSize) {
          uVar6 = pNew->vBarBufs->pArray[uVar6];
          if (-1 < (int)uVar6) {
            return uVar6 ^ (uVar1 ^ iRes) & 1;
          }
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_0089ecd1:
  if (((iLNtk < 1) || (iRNtk < 1)) || ((p->nNtks < iLNtk || (p->nNtks < iRNtk)))) {
    __assert_fail("Bac_ManNtkIsOk(p, iLNtk) && Bac_ManNtkIsOk(p, iRNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x60,
                  "int Bac_ManAddBarbuf(Gia_Man_t *, int, Bac_Man_t *, int, int, int, int, Vec_Int_t *)"
                 );
  }
  Vec_IntPush(&p->vBuf2LeafNtk,iLNtk);
  Vec_IntPush(&p->vBuf2LeafObj,iLObj);
  Vec_IntPush(&p->vBuf2RootNtk,iRNtk);
  Vec_IntPush(&p->vBuf2RootObj,iRObj);
  pGVar4 = Gia_ManAppendObj(pNew);
  uVar1 = (uint)iRes >> 1;
  if (pNew->nObjs <= (int)uVar1) {
    __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x30b,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
  }
  pGVar3 = pNew->pObjs;
  if ((pGVar3 <= pGVar4) && (pGVar4 < pGVar3 + pNew->nObjs)) {
    uVar5 = (ulong)(((uint)((int)pGVar4 - (int)pGVar3) >> 2) * -0x55555555 - uVar1 & 0x1fffffff);
    uVar6 = iRes & 1;
    *(ulong *)pGVar4 =
         (ulong)(uVar6 << 0x1d) |
         (ulong)uVar6 << 0x3d | *(ulong *)pGVar4 & 0xc0000000c0000000 | uVar5 << 0x20 | uVar5;
    pNew->nBufs = pNew->nBufs + 1;
    pGVar3 = pNew->pObjs;
    if ((pGVar3 <= pGVar4) && (pGVar4 < pGVar3 + pNew->nObjs)) {
      Entry = (int)((ulong)((long)pGVar4 - (long)pGVar3) >> 2) * 0x55555556;
      if (vMap == (Vec_Int_t *)0x0) {
        return Entry;
      }
      iVar2 = pNew->vBarBufs->nSize;
      if (-1 < iVar2) {
        Vec_IntFillExtra(vMap,uVar1 + 1,-1);
        if ((int)uVar1 < vMap->nSize) {
          vMap->pArray[uVar1] = uVar6 + iVar2 * 2;
          Vec_IntPush(pNew->vBarBufs,Entry);
          return Entry;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Bac_ManAddBarbuf( Gia_Man_t * pNew, int iRes, Bac_Man_t * p, int iLNtk, int iLObj, int iRNtk, int iRObj, Vec_Int_t * vMap )
{
    int iBufLit, iIdLit;
    if ( iRes == 0 || iRes == 1 )
        return iRes;
    assert( iRes > 0 );
    if ( vMap && Abc_Lit2Var(iRes) < Vec_IntSize(vMap) && (iIdLit = Vec_IntEntry(vMap, Abc_Lit2Var(iRes))) >= 0 && 
        Vec_IntEntry(&p->vBuf2LeafNtk, Abc_Lit2Var(iIdLit)) == iLNtk && Vec_IntEntry(&p->vBuf2RootNtk, Abc_Lit2Var(iIdLit)) == iRNtk )
        return Abc_LitNotCond( Vec_IntEntry(pNew->vBarBufs, Abc_Lit2Var(iIdLit)), Abc_LitIsCompl(iRes) ^ Abc_LitIsCompl(iIdLit) );
    assert( Bac_ManNtkIsOk(p, iLNtk) && Bac_ManNtkIsOk(p, iRNtk) );
    Vec_IntPush( &p->vBuf2LeafNtk, iLNtk );
    Vec_IntPush( &p->vBuf2LeafObj, iLObj );
    Vec_IntPush( &p->vBuf2RootNtk, iRNtk );
    Vec_IntPush( &p->vBuf2RootObj, iRObj );
    iBufLit = Gia_ManAppendBuf( pNew, iRes );
    if ( vMap )
    {
        Vec_IntSetEntryFull( vMap, Abc_Lit2Var(iRes), Abc_Var2Lit(Vec_IntSize(pNew->vBarBufs), Abc_LitIsCompl(iRes)) );
        Vec_IntPush( pNew->vBarBufs, iBufLit );
    }
    return iBufLit;
}